

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O2

void deqp::gles3::Functional::getAffineTexCoord3D
               (vector<float,_std::allocator<float>_> *dst,int cellNdx)

{
  pointer pfVar1;
  Vec3 p3;
  Vec3 p2;
  Vec3 p1;
  Vec3 p0;
  Mat3 rotMatrix;
  Vector<float,_3> local_b0;
  Vector<float,_3> local_a0;
  Matrix<float,_3,_3> local_90;
  Matrix<float,_3,_3> local_68;
  Matrix<float,_3,_3> local_44;
  Vector<float,_3> local_20;
  
  getBasicTexCoord3D(dst,cellNdx);
  tcu::rotationMatrixX(&local_68,(float)cellNdx * 0.0625 * 6.2831855 + 0.0);
  tcu::rotationMatrixY(&local_90,(float)cellNdx * 0.03125 * 6.2831855 + 1.0);
  tcu::operator*(&local_44,&local_68,&local_90);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_90.m_data.m_data[0].m_data[2] = pfVar1[2];
  local_90.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)pfVar1;
  tcu::operator*((tcu *)&local_68,&local_44,(Vector<float,_3> *)&local_90);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_a0.m_data[2] = pfVar1[5];
  local_a0.m_data._0_8_ = *(undefined8 *)(pfVar1 + 3);
  tcu::operator*((tcu *)&local_90,&local_44,&local_a0);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_b0.m_data[2] = pfVar1[8];
  local_b0.m_data._0_8_ = *(undefined8 *)(pfVar1 + 6);
  tcu::operator*((tcu *)&local_a0,&local_44,&local_b0);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_20.m_data[2] = pfVar1[0xb];
  local_20.m_data._0_8_ = *(undefined8 *)(pfVar1 + 9);
  tcu::operator*((tcu *)&local_b0,&local_44,&local_20);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  *pfVar1 = local_68.m_data.m_data[0].m_data[0];
  pfVar1[1] = local_68.m_data.m_data[0].m_data[1];
  pfVar1[2] = local_68.m_data.m_data[0].m_data[2];
  pfVar1[3] = local_90.m_data.m_data[0].m_data[0];
  pfVar1[4] = local_90.m_data.m_data[0].m_data[1];
  pfVar1[5] = local_90.m_data.m_data[0].m_data[2];
  pfVar1[6] = local_a0.m_data[0];
  pfVar1[7] = local_a0.m_data[1];
  pfVar1[8] = local_a0.m_data[2];
  pfVar1[9] = local_b0.m_data[0];
  pfVar1[10] = local_b0.m_data[1];
  pfVar1[0xb] = local_b0.m_data[2];
  return;
}

Assistant:

static void getAffineTexCoord3D (std::vector<float>& dst, int cellNdx)
{
	// Use basic coords as base.
	getBasicTexCoord3D(dst, cellNdx);

	// Rotate based on cell index.
	float		angleX		= 0.0f + 2.0f*DE_PI * ((float)cellNdx / 16.0f);
	float		angleY		= 1.0f + 2.0f*DE_PI * ((float)cellNdx / 32.0f);
	tcu::Mat3	rotMatrix	= tcu::rotationMatrixX(angleX) * tcu::rotationMatrixY(angleY);

	Vec3		p0			= rotMatrix * Vec3(dst[0], dst[ 1], dst[ 2]);
	Vec3		p1			= rotMatrix * Vec3(dst[3], dst[ 4], dst[ 5]);
	Vec3		p2			= rotMatrix * Vec3(dst[6], dst[ 7], dst[ 8]);
	Vec3		p3			= rotMatrix * Vec3(dst[9], dst[10], dst[11]);

	dst[0] = p0.x();	dst[ 1] = p0.y();	dst[ 2] = p0.z();
	dst[3] = p1.x();	dst[ 4] = p1.y();	dst[ 5] = p1.z();
	dst[6] = p2.x();	dst[ 7] = p2.y();	dst[ 8] = p2.z();
	dst[9] = p3.x();	dst[10] = p3.y();	dst[11] = p3.z();
}